

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.h
# Opt level: O0

TxOutReference * __thiscall
cfd::core::TxOutReference::operator=(TxOutReference *this,TxOutReference *param_1)

{
  TxOutReference *param_1_local;
  TxOutReference *this_local;
  
  AbstractTxOutReference::operator=
            (&this->super_AbstractTxOutReference,&param_1->super_AbstractTxOutReference);
  return this;
}

Assistant:

class CFD_CORE_EXPORT TxOutReference : public AbstractTxOutReference {
 public:
  /**
   * @brief constructor
   * @param[in] tx_out  TxOut instance
   */
  explicit TxOutReference(const TxOut& tx_out);
  /**
   * @brief default constructor.
   */
  TxOutReference() : TxOutReference(TxOut()) {
    // do nothing
  }
  /**
   * @brief destructor
   */
  virtual ~TxOutReference() {
    // do nothing
  }
}